

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuEither.hpp
# Opt level: O0

void __thiscall tcu::Either<int,_float>::release(Either<int,_float> *this)

{
  Either<int,_float> *this_local;
  
  this->m_isFirst = true;
  (this->field_1).m_first = (int *)0x0;
  return;
}

Assistant:

void Either<First, Second>::release (void)
{
	if (m_isFirst)
		m_first->~First();
	else
		m_second->~Second();

	m_isFirst	= true;
	m_first		= DE_NULL;
}